

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

void __thiscall
AddrManImpl::Serialize<HashedSourceWriter<AutoFile>>
          (AddrManImpl *this,HashedSourceWriter<AutoFile> *s_)

{
  int i;
  mapped_type *pmVar1;
  long lVar2;
  uint32_t *puVar3;
  __node_base *p_Var4;
  uint32_t obj;
  nid_type (*panVar5) [64];
  int bucket;
  int iVar6;
  long lVar7;
  __node_base *p_Var8;
  long in_FS_OFFSET;
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  mapUnkIds;
  ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> s;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock0,&this->cs,"cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
             ,0x87,false);
  s.m_params = &CAddress::V2_DISK;
  s.m_substream = s_;
  ser_writedata8<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(&s,'\x04');
  ser_writedata8<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(&s,'$');
  base_blob<256u>::Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
            ((base_blob<256u> *)&this->nKey,&s);
  ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
            ((ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams> *)&s,&this->nNew);
  ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
            ((ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams> *)&s,&this->nTried);
  ser_writedata32<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(&s,0x40000400);
  mapUnkIds._M_h._M_buckets = &mapUnkIds._M_h._M_single_bucket;
  mapUnkIds._M_h._M_bucket_count = 1;
  mapUnkIds._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mapUnkIds._M_h._M_element_count = 0;
  mapUnkIds._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  mapUnkIds._M_h._M_rehash_policy._M_next_resize = 0;
  mapUnkIds._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var8 = &(this->mapInfo)._M_h._M_before_begin;
  iVar6 = 0;
  p_Var4 = p_Var8;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    pmVar1 = std::__detail::
             _Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&mapUnkIds,(key_type *)(p_Var4 + 1));
    *pmVar1 = iVar6;
    if (*(int *)((long)&p_Var4[0x10]._M_nxt + 4) != 0) {
      if (iVar6 == this->nNew) {
        __assert_fail("nIds != nNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                      ,0xc5,
                      "void AddrManImpl::Serialize(Stream &) const [Stream = HashedSourceWriter<AutoFile>]"
                     );
      }
      AddrInfo::
      SerializationOps<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,AddrInfo_const,ActionSerialize>
                ((_Prime_rehash_policy *)(p_Var4 + 2));
      iVar6 = iVar6 + 1;
    }
  }
  iVar6 = 0;
  while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
    if (*(char *)&p_Var8[0x11]._M_nxt == '\x01') {
      if (iVar6 == this->nTried) {
        __assert_fail("nIds != nTried",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                      ,0xce,
                      "void AddrManImpl::Serialize(Stream &) const [Stream = HashedSourceWriter<AutoFile>]"
                     );
      }
      AddrInfo::
      SerializationOps<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,AddrInfo_const,ActionSerialize>
                ((_Prime_rehash_policy *)(p_Var8 + 2));
      iVar6 = iVar6 + 1;
    }
  }
  panVar5 = this->vvNew;
  for (lVar7 = 0; lVar7 != 0x400; lVar7 = lVar7 + 1) {
    obj = 0;
    for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
      obj = obj + ((*panVar5)[lVar2] != -1);
    }
    ser_writedata32<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(&s,obj);
    for (lVar2 = 0; lVar2 != 0x200; lVar2 = lVar2 + 8) {
      if (*(long *)((long)*panVar5 + lVar2) != -1) {
        puVar3 = (uint32_t *)
                 std::__detail::
                 _Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&mapUnkIds,(key_type *)((long)*panVar5 + lVar2));
        ser_writedata32<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(&s,*puVar3)
        ;
      }
    }
    panVar5 = panVar5 + 1;
  }
  NetGroupManager::GetAsmapChecksum(&local_58,this->m_netgroupman);
  base_blob<256u>::Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
            ((base_blob<256u> *)&local_58,&s);
  std::
  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&mapUnkIds._M_h);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock0.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Serialize(Stream& s_) const
{
    LOCK(cs);

    /**
     * Serialized format.
     * * format version byte (@see `Format`)
     * * lowest compatible format version byte. This is used to help old software decide
     *   whether to parse the file. For example:
     *   * Bitcoin Core version N knows how to parse up to format=3. If a new format=4 is
     *     introduced in version N+1 that is compatible with format=3 and it is known that
     *     version N will be able to parse it, then version N+1 will write
     *     (format=4, lowest_compatible=3) in the first two bytes of the file, and so
     *     version N will still try to parse it.
     *   * Bitcoin Core version N+2 introduces a new incompatible format=5. It will write
     *     (format=5, lowest_compatible=5) and so any versions that do not know how to parse
     *     format=5 will not try to read the file.
     * * nKey
     * * nNew
     * * nTried
     * * number of "new" buckets XOR 2**30
     * * all new addresses (total count: nNew)
     * * all tried addresses (total count: nTried)
     * * for each new bucket:
     *   * number of elements
     *   * for each element: index in the serialized "all new addresses"
     * * asmap checksum
     *
     * 2**30 is xorred with the number of buckets to make addrman deserializer v0 detect it
     * as incompatible. This is necessary because it did not check the version number on
     * deserialization.
     *
     * vvNew, vvTried, mapInfo, mapAddr and vRandom are never encoded explicitly;
     * they are instead reconstructed from the other information.
     *
     * This format is more complex, but significantly smaller (at most 1.5 MiB), and supports
     * changes to the ADDRMAN_ parameters without breaking the on-disk structure.
     *
     * We don't use SERIALIZE_METHODS since the serialization and deserialization code has
     * very little in common.
     */

    // Always serialize in the latest version (FILE_FORMAT).
    ParamsStream s{s_, CAddress::V2_DISK};

    s << static_cast<uint8_t>(FILE_FORMAT);

    // Increment `lowest_compatible` iff a newly introduced format is incompatible with
    // the previous one.
    static constexpr uint8_t lowest_compatible = Format::V4_MULTIPORT;
    s << static_cast<uint8_t>(INCOMPATIBILITY_BASE + lowest_compatible);

    s << nKey;
    s << nNew;
    s << nTried;

    int nUBuckets = ADDRMAN_NEW_BUCKET_COUNT ^ (1 << 30);
    s << nUBuckets;
    std::unordered_map<nid_type, int> mapUnkIds;
    int nIds = 0;
    for (const auto& entry : mapInfo) {
        mapUnkIds[entry.first] = nIds;
        const AddrInfo& info = entry.second;
        if (info.nRefCount) {
            assert(nIds != nNew); // this means nNew was wrong, oh ow
            s << info;
            nIds++;
        }
    }
    nIds = 0;
    for (const auto& entry : mapInfo) {
        const AddrInfo& info = entry.second;
        if (info.fInTried) {
            assert(nIds != nTried); // this means nTried was wrong, oh ow
            s << info;
            nIds++;
        }
    }
    for (int bucket = 0; bucket < ADDRMAN_NEW_BUCKET_COUNT; bucket++) {
        int nSize = 0;
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvNew[bucket][i] != -1)
                nSize++;
        }
        s << nSize;
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvNew[bucket][i] != -1) {
                int nIndex = mapUnkIds[vvNew[bucket][i]];
                s << nIndex;
            }
        }
    }
    // Store asmap checksum after bucket entries so that it
    // can be ignored by older clients for backward compatibility.
    s << m_netgroupman.GetAsmapChecksum();
}